

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_paddsh_mips64(uint64_t fs,uint64_t ft)

{
  short sVar1;
  short sVar2;
  long lVar3;
  ushort uVar4;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar3 = 0;
  do {
    sVar1 = *(short *)((long)&vs + lVar3 * 2);
    sVar2 = *(short *)((long)&vt + lVar3 * 2);
    uVar4 = sVar1 + sVar2;
    if (SCARRY2(sVar1,sVar2)) {
      uVar4 = (short)(sVar1 + sVar2) >> 0xf ^ 0x8000;
    }
    *(ushort *)((long)&vs + lVar3 * 2) = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_paddsh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        int r = vs.sh[i] + vt.sh[i];
        vs.sh[i] = SATSH(r);
    }
    return vs.d;
}